

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O3

function<chaiscript::Boxed_Value_()> * __thiscall
chaiscript::dispatch::functor<chaiscript::Boxed_Value()>
          (function<chaiscript::Boxed_Value_()> *__return_storage_ptr__,dispatch *this,
          Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  chaiscript acStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
            (acStack_28,(Boxed_Value *)this,(Type_Conversions_State *)bv);
  functor<chaiscript::Boxed_Value()>
            (__return_storage_ptr__,(dispatch *)acStack_28,(Const_Proxy_Function *)bv,t_conversions)
  ;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<FunctionType> functor(const Boxed_Value &bv, const Type_Conversions_State *t_conversions) {
      return functor<FunctionType>(boxed_cast<Const_Proxy_Function>(bv, t_conversions), t_conversions);
    }